

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quote_collector.cpp
# Opt level: O3

bool __thiscall
skiwi::anon_unknown_2::quote_collector_visitor::_previsit(quote_collector_visitor *this,Quote *q)

{
  mapped_type *pmVar1;
  stringstream str;
  key_type local_1b8;
  stringstream local_198 [16];
  ostream local_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::stringstream::stringstream(local_198);
  operator<<(local_188,&q->arg);
  std::__cxx11::stringbuf::str();
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cell>_>_>
           ::operator[](&this->collected_quotes,&local_1b8);
  pmVar1->type = (q->arg).type;
  std::__cxx11::string::_M_assign((string *)&pmVar1->value);
  std::vector<skiwi::cell,_std::allocator<skiwi::cell>_>::operator=(&pmVar1->pair,&(q->arg).pair);
  std::vector<skiwi::cell,_std::allocator<skiwi::cell>_>::operator=(&pmVar1->vec,&(q->arg).vec);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_198);
  std::ios_base::~ios_base(local_118);
  return true;
}

Assistant:

virtual bool _previsit(Quote& q)
      {
      std::stringstream str;
      str << q.arg;
      collected_quotes[str.str()] = q.arg;
      return true;
      }